

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O0

vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
* __thiscall
PDA::getStateCombinations
          (vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
           *__return_storage_ptr__,PDA *this,int size)

{
  State *pSVar1;
  initializer_list<State_*> __l;
  initializer_list<State_*> __l_00;
  bool bVar2;
  reference ppSVar3;
  reference __x;
  allocator<State_*> local_151;
  State *local_150;
  iterator local_148;
  size_type local_140;
  vector<State_*,_std::allocator<State_*>_> local_138;
  vector<State_*,_std::allocator<State_*>_> local_120;
  undefined1 local_108 [8];
  vector<State_*,_std::allocator<State_*>_> combination;
  iterator __end4;
  iterator __begin4;
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  *__range4;
  State *state_1;
  iterator __end3;
  iterator __begin3;
  vector<State_*,_std::allocator<State_*>_> *__range3;
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  smallerCombinations;
  allocator<State_*> local_89;
  State *local_88;
  iterator local_80;
  size_type local_78;
  vector<State_*,_std::allocator<State_*>_> local_70;
  State *local_58;
  State *state;
  iterator __end2;
  iterator __begin2;
  vector<State_*,_std::allocator<State_*>_> *__range2;
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  combinations;
  int size_local;
  PDA *this_local;
  
  combinations.
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = size;
  memset(&__range2,0,0x18);
  std::
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  ::vector((vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
            *)&__range2);
  if (combinations.
      super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 1) {
    __end2 = std::vector<State_*,_std::allocator<State_*>_>::begin(&this->statesQ);
    state = (State *)std::vector<State_*,_std::allocator<State_*>_>::end(&this->statesQ);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>
                                       *)&state), bVar2) {
      ppSVar3 = __gnu_cxx::
                __normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
                operator*(&__end2);
      local_88 = *ppSVar3;
      local_80 = &local_88;
      local_78 = 1;
      local_58 = local_88;
      std::allocator<State_*>::allocator(&local_89);
      __l_00._M_len = local_78;
      __l_00._M_array = local_80;
      std::vector<State_*,_std::allocator<State_*>_>::vector(&local_70,__l_00,&local_89);
      std::
      vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
      ::push_back((vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
                   *)&__range2,&local_70);
      std::vector<State_*,_std::allocator<State_*>_>::~vector(&local_70);
      std::allocator<State_*>::~allocator(&local_89);
      __gnu_cxx::__normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
      operator++(&__end2);
    }
  }
  else {
    if (combinations.
        super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 1) {
      memset(__return_storage_ptr__,0,0x18);
      std::
      vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
      ::vector(__return_storage_ptr__);
      goto LAB_00117c5e;
    }
    getStateCombinations
              ((vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
                *)&__range3,this,
               combinations.
               super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1);
    __end3 = std::vector<State_*,_std::allocator<State_*>_>::begin(&this->statesQ);
    state_1 = (State *)std::vector<State_*,_std::allocator<State_*>_>::end(&this->statesQ);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>
                                       *)&state_1), bVar2) {
      ppSVar3 = __gnu_cxx::
                __normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
                operator*(&__end3);
      pSVar1 = *ppSVar3;
      __end4 = std::
               vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
               ::begin((vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
                        *)&__range3);
      combination.super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
                    ::end((vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
                           *)&__range3);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<std::vector<State_*,_std::allocator<State_*>_>_*,_std::vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>_>
                                         *)&combination.
                                            super__Vector_base<State_*,_std::allocator<State_*>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage),
            bVar2) {
        __x = __gnu_cxx::
              __normal_iterator<std::vector<State_*,_std::allocator<State_*>_>_*,_std::vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>_>
              ::operator*(&__end4);
        std::vector<State_*,_std::allocator<State_*>_>::vector
                  ((vector<State_*,_std::allocator<State_*>_> *)local_108,__x);
        local_148 = &local_150;
        local_140 = 1;
        local_150 = pSVar1;
        std::allocator<State_*>::allocator(&local_151);
        __l._M_len = local_140;
        __l._M_array = local_148;
        std::vector<State_*,_std::allocator<State_*>_>::vector(&local_138,__l,&local_151);
        vectorUnion(&local_120,&local_138,(vector<State_*,_std::allocator<State_*>_> *)local_108);
        std::
        vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
        ::push_back((vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
                     *)&__range2,&local_120);
        std::vector<State_*,_std::allocator<State_*>_>::~vector(&local_120);
        std::vector<State_*,_std::allocator<State_*>_>::~vector(&local_138);
        std::allocator<State_*>::~allocator(&local_151);
        std::vector<State_*,_std::allocator<State_*>_>::~vector
                  ((vector<State_*,_std::allocator<State_*>_> *)local_108);
        __gnu_cxx::
        __normal_iterator<std::vector<State_*,_std::allocator<State_*>_>_*,_std::vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>_>
        ::operator++(&__end4);
      }
      __gnu_cxx::__normal_iterator<State_**,_std::vector<State_*,_std::allocator<State_*>_>_>::
      operator++(&__end3);
    }
    std::
    vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
    ::~vector((vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
               *)&__range3);
  }
  std::
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  ::vector(__return_storage_ptr__,
           (vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
            *)&__range2);
LAB_00117c5e:
  smallerCombinations.
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  std::
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  ::~vector((vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
             *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<State *>> PDA::getStateCombinations(int size) {
    std::vector<std::vector<State*>> combinations = {};
    if(size == 1) {
        for(State* state: statesQ){
            combinations.push_back({state});
        }
    } else if (size < 1) {
        return {};
    } else {
        std::vector<std::vector<State*>> smallerCombinations = getStateCombinations(size-1);
        for (State* state: statesQ) {
            for(std::vector<State*> combination: smallerCombinations){
                combinations.push_back(vectorUnion({state}, combination));
            }
        }
    }

    return combinations;
}